

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter.h
# Opt level: O3

optional<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
* __thiscall
viras::iter::
ValsIter<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_1U>
::next(optional<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
       *__return_storage_ptr__,
      ValsIter<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_1U>
      *this)

{
  undefined8 uVar1;
  TermList TVar2;
  undefined8 uVar3;
  bool bVar4;
  
  if (this->_cur == 0) {
    this->_cur = 1;
    uVar1 = this->_vals[0].term.
            super__Optional_base<viras::Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<viras::Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
            ._M_payload._M_value.
            super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
            .config;
    TVar2._content =
         ((TermList *)
         ((long)&this->_vals[0].term.
                 super__Optional_base<viras::Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<viras::Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
                 ._M_payload._M_value.
                 super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
         + 8))->_content;
    uVar3 = *(undefined8 *)
             &this->_vals[0].term.
              super__Optional_base<viras::Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<viras::Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
              .field_0x12;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_true,_false,_false>
             .
             super__Optional_payload_base<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
             ._M_payload + 10) =
         *(undefined8 *)
          ((long)&this->_vals[0].term.
                  super__Optional_base<viras::Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<viras::Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
                  ._M_payload._M_value.
                  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
          + 10);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_true,_false,_false>
             .
             super__Optional_payload_base<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
             ._M_payload + 0x12) = uVar3;
    *(undefined8 *)
     &(__return_storage_ptr__->
      super__Optional_base<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_true,_false,_false>
      .
      super__Optional_payload_base<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
      ._M_payload = uVar1;
    *(uint64_t *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_true,_false,_false>
             .
             super__Optional_payload_base<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
             ._M_payload + 8) = TVar2._content;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_true,_false,_false>
             .
             super__Optional_payload_base<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
             ._M_payload + 0x48) = 0;
    if (this->_vals[0].period.
        super__Optional_base<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_true,_false,_false>
        .
        super__Optional_payload_base<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
        ._M_engaged == true) {
      std::
      _Optional_payload_base<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>>,viras::DefaultOpts>>>
      ::
      _M_construct<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>>,viras::DefaultOpts>>>
                ((_Optional_payload_base<viras::Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>>,viras::DefaultOpts>>>
                  *)&(__return_storage_ptr__->
                     super__Optional_base<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
                     ._M_payload._M_value.period,
                 (Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
                  *)&this->_vals[0].period);
    }
    (__return_storage_ptr__->
    super__Optional_base<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_true,_false,_false>
    .
    super__Optional_payload_base<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
    ._M_payload._M_value.infty.super__Optional_base<viras::Infty,_true,_true> =
         (_Optional_base<viras::Infty,_true,_true>)
         this->_vals[0].infty.super__Optional_base<viras::Infty,_true,_true>._M_payload.
         super__Optional_payload_base<viras::Infty>;
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
  (__return_storage_ptr__->
  super__Optional_base<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_true,_false,_false>
  .
  super__Optional_payload_base<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>
  ._M_engaged = bVar4;
  return __return_storage_ptr__;
}

Assistant:

auto next() -> std::optional<A>
      { return _cur < N ? std::optional<A>(std::move(_vals[_cur++]))
                        : std::optional<A>(); }